

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::printTotals(ConsoleReporter *this,Totals *totals)

{
  size_t sVar1;
  ostream *poVar2;
  Counts *in_RSI;
  long in_RDI;
  Colour colour_1;
  Colour colour;
  undefined4 in_stack_fffffffffffffe88;
  Code in_stack_fffffffffffffe8c;
  pluralise *in_stack_fffffffffffffe90;
  string *in_stack_fffffffffffffe98;
  ConsoleReporter *in_stack_fffffffffffffea0;
  allocator *paVar3;
  allocator local_111;
  string local_110 [79];
  allocator local_c1;
  string local_c0 [79];
  allocator local_71;
  string local_70 [55];
  allocator local_39;
  string local_38 [40];
  Counts *local_10;
  
  local_10 = in_RSI;
  sVar1 = Counts::total(in_RSI);
  if (sVar1 == 0) {
    std::operator<<(*(ostream **)(in_RDI + 0x168),"No tests ran");
  }
  else if (local_10->failed == 0) {
    Colour::Colour((Colour *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    std::operator<<(*(ostream **)(in_RDI + 0x168),"All tests passed (");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"assertion",&local_c1);
    pluralise::pluralise
              (in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(string *)0x1f282d);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffe90,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::operator<<(poVar2," in ");
    paVar3 = &local_111;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_110,"test case",paVar3);
    pluralise::pluralise
              (in_stack_fffffffffffffe90,
               CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),(string *)0x1f28af);
    poVar2 = operator<<((ostream *)in_stack_fffffffffffffe90,
                        (pluralise *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
    std::operator<<(poVar2,")");
    pluralise::~pluralise((pluralise *)0x1f28ea);
    std::__cxx11::string::~string(local_110);
    std::allocator<char>::~allocator((allocator<char> *)&local_111);
    pluralise::~pluralise((pluralise *)0x1f290b);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
    Colour::~Colour((Colour *)0x1f2932);
  }
  else {
    Colour::Colour((Colour *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"test case",&local_39);
    printCounts(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                (Counts *)in_stack_fffffffffffffe90);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    if (local_10[1].failed != 0) {
      std::operator<<(*(ostream **)(in_RDI + 0x168)," (");
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_70,"assertion",&local_71);
      printCounts(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                  (Counts *)in_stack_fffffffffffffe90);
      std::__cxx11::string::~string(local_70);
      std::allocator<char>::~allocator((allocator<char> *)&local_71);
      std::operator<<(*(ostream **)(in_RDI + 0x168),")");
    }
    Colour::~Colour((Colour *)0x1f278e);
  }
  return;
}

Assistant:

void printTotals( const Totals& totals ) {
            if( totals.assertions.total() == 0 ) {
                stream << "No tests ran";
            }
            else if( totals.assertions.failed ) {
                Colour colour( Colour::ResultError );
                printCounts( "test case", totals.testCases );
                if( totals.testCases.failed > 0 ) {
                    stream << " (";
                    printCounts( "assertion", totals.assertions );
                    stream << ")";
                }
            }
            else {
                Colour colour( Colour::ResultSuccess );
                stream << "All tests passed ("
                        << pluralise( totals.assertions.passed, "assertion" ) << " in "
                        << pluralise( totals.testCases.passed, "test case" ) << ")";
            }
        }